

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solverational.hpp
# Opt level: O1

bool __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::_reconstructSolutionRational
          (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,SolRational *sol,
          DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
          *basisStatusRows,
          DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
          *basisStatusCols,Rational *denomBoundSquared)

{
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  *pVVar1;
  int *piVar2;
  SolRational *this_00;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  *this_01;
  RangeType RVar3;
  VarStatus VVar4;
  VarStatus *pVVar5;
  pointer pnVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  long lVar14;
  long *plVar15;
  Verbosity old_verbosity;
  Verbosity VVar16;
  long lVar17;
  long lVar18;
  byte bVar19;
  long lVar20;
  type t;
  DIdxSet basicIndices;
  string local_108;
  data_type local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  uint local_c8;
  void *local_c0;
  char local_b3;
  char local_b2;
  Rational *local_a8;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  *local_a0;
  SolRational *local_98;
  SPxOut *local_90;
  SolRational *local_88;
  undefined1 local_80 [32];
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  *local_60;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_58;
  DIdxSet local_50;
  
  DIdxSet::DIdxSet(&local_50,
                   (this->_rationalLP->
                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                   ).
                   super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                   .set.thenum);
  if ((~sol->field_0xd0 & 5) == 0) {
    local_a8 = denomBoundSquared;
    (*this->_statistics->reconstructionTime->_vptr_Timer[3])();
    piVar2 = &this->_statistics->rationalReconstructions;
    *piVar2 = *piVar2 + 1;
    this_00 = &this->_workSol;
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
    ::operator=(&this_00->_primal,&sol->_primal);
    if (0 < (this->_rationalLP->
            super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
            ).
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
            .set.thenum) {
      lVar20 = 0;
      do {
        if (basisStatusCols->data[lVar20] == BASIC) {
          DIdxSet::addIdx(&local_50,(int)lVar20);
        }
        lVar20 = lVar20 + 1;
      } while (lVar20 < (this->_rationalLP->
                        super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                        ).
                        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                        .set.thenum);
    }
    bVar9 = reconstructVector(&this_00->_primal,local_a8,&local_50);
    if (bVar9) {
      lVar20 = (long)(this->_rationalLP->
                     super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                     ).
                     super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                     .set.thenum;
      bVar19 = lVar20 < 1;
      local_98 = this_00;
      local_88 = sol;
      if (lVar20 < 1) {
        bVar9 = true;
      }
      else {
        bVar9 = true;
        lVar18 = lVar20 + 1;
        lVar20 = lVar20 << 6;
        local_58 = this;
        do {
          pVVar5 = (this->_basisStatusCols).data;
          if ((((pVVar5[lVar18 + -2] == FIXED) &&
               (iVar11 = boost::multiprecision::backends::
                         rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                         ::compare((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                    *)((long)&(this->_workSol)._primal.val.
                                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start
                                              [0xffffffffffffffff].m_backend.m_value.num.m_backend.
                                              super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                              .m_data + lVar20),
                                   (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                    *)((long)&(this->_rationalLP->
                                              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                                              ).low.val.
                                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start[-1].
                                              m_backend.m_value.num.m_backend.
                                              super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                              .m_data + lVar20)), iVar11 != 0)) ||
              ((pVVar5[lVar18 + -2] == ON_LOWER &&
               (iVar11 = boost::multiprecision::backends::
                         rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                         ::compare((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                    *)((long)&(this->_workSol)._primal.val.
                                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start
                                              [0xffffffffffffffff].m_backend.m_value.num.m_backend.
                                              super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                              .m_data + lVar20),
                                   (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                    *)((long)&(this->_rationalLP->
                                              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                                              ).low.val.
                                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start[-1].
                                              m_backend.m_value.num.m_backend.
                                              super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                              .m_data + lVar20)), iVar11 != 0)))) ||
             ((pVVar5[lVar18 + -2] == ON_UPPER &&
              (iVar11 = boost::multiprecision::backends::
                        rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                        ::compare((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                   *)((long)&(this->_workSol)._primal.val.
                                             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start
                                             [0xffffffffffffffff].m_backend.m_value.num.m_backend.
                                             super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                             .m_data + lVar20),
                                  (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                   *)((long)&(this->_rationalLP->
                                             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                                             ).up.val.
                                             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start[-1].m_backend
                                             .m_value.num.m_backend.
                                             super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                             .m_data + lVar20)), iVar11 != 0)))) {
LAB_0035e5b6:
            bVar9 = false;
          }
          else {
            if (pVVar5[lVar18 + -2] == ZERO) {
              local_a0 = (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                          *)CONCAT71(local_a0._1_7_,bVar19);
              pnVar6 = (local_98->_primal).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              local_108._M_dataplus._M_p = (pointer)0x0;
              boost::multiprecision::backends::
              rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
              ::rational_adaptor<long_long>
                        ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                          *)&local_e8.ld,(longlong *)&local_108,(type *)0x0);
              iVar11 = boost::multiprecision::backends::
                       rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                       ::compare((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                  *)((long)&pnVar6[0xffffffffffffffff].m_backend.m_value.num.
                                            m_backend.
                                            super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                            .m_data + lVar20),
                                 (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                  *)&local_e8.ld);
              if ((local_b3 == '\0') && (local_b2 == '\0')) {
                operator_delete(local_c0,(ulong)local_c8 << 3);
              }
              if ((local_d8._M_local_buf[5] == '\0') && (local_d8._M_local_buf[6] == '\0')) {
                operator_delete(local_e8.ld.data,(ulong)local_e8.ld.capacity << 3);
              }
              this = local_58;
              bVar19 = (byte)local_a0;
              if (iVar11 != 0) goto LAB_0035e5b6;
            }
            if (pVVar5[lVar18 + -2] == UNDEFINED) goto LAB_0035e5b6;
          }
          RVar3 = (this->_colTypes).data[lVar18 + -2];
          if (((RVar3 < (RANGETYPE_FIXED|RANGETYPE_LOWER)) && ((0x1aU >> (RVar3 & 0x1f) & 1) != 0))
             && (iVar11 = boost::multiprecision::backends::
                          rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                          ::compare((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                     *)((long)&(this->_workSol)._primal.val.
                                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start
                                               [0xffffffffffffffff].m_backend.m_value.num.m_backend.
                                               super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                               .m_data + lVar20),
                                    (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                     *)((long)&(this->_rationalLP->
                                               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                                               ).low.val.
                                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start[-1].
                                               m_backend.m_value.num.m_backend.
                                               super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                               .m_data + lVar20)), iVar11 < 0)) {
            local_80._0_8_ =
                 (long)&(this->_rationalLP->
                        super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                        ).low.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.m_value.num.
                        m_backend.
                        super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                        .m_data + lVar20;
            local_80._8_8_ =
                 (long)&(this->_workSol)._primal.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[0xffffffffffffffff].m_backend.
                        m_value.num.m_backend.
                        super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                        .m_data + lVar20;
            boost::multiprecision::
            number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
            ::
            number<boost::multiprecision::detail::subtract_immediates,boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>,boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>,void,void>
                      ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
                        *)&local_e8.ld,
                       (expression<boost::multiprecision::detail::subtract_immediates,_boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_void,_void>
                        *)local_80,(type *)0x0);
            boost::multiprecision::backends::
            rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
            ::str_abi_cxx11_(&local_108,
                             (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
                              *)&local_e8.ld,0,~(_S_ios_fmtflags_min|_S_ios_fmtflags_max));
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_108._M_dataplus._M_p != &local_108.field_2) {
              operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1
                             );
            }
            if ((local_b3 == '\0') && (local_b2 == '\0')) {
              operator_delete(local_c0,(ulong)local_c8 << 3);
            }
            if ((local_d8._M_local_buf[5] == '\0') && (local_d8._M_local_buf[6] == '\0')) {
              operator_delete(local_e8.ld.data,(ulong)local_e8.ld.capacity << 3);
            }
            VVar16 = (this->spxout).m_verbosity;
            if (2 < (int)VVar16) {
              (this->spxout).m_verbosity = INFO1;
              soplex::operator<<(&this->spxout,"Reconstructed solution primal infeasible (1).\n");
LAB_0035e827:
              (this->spxout).m_verbosity = VVar16;
            }
LAB_0035e82a:
            (*this->_statistics->reconstructionTime->_vptr_Timer[4])();
            break;
          }
          if (((this->_colTypes).data[lVar18 + -2] - RANGETYPE_UPPER < 3) &&
             (iVar11 = boost::multiprecision::backends::
                       rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                       ::compare((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                  *)((long)&(this->_workSol)._primal.val.
                                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start
                                            [0xffffffffffffffff].m_backend.m_value.num.m_backend.
                                            super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                            .m_data + lVar20),
                                 (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                  *)((long)&(this->_rationalLP->
                                            super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                                            ).up.val.
                                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.
                                            m_value.num.m_backend.
                                            super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                            .m_data + lVar20)), 0 < iVar11)) {
            local_80._0_8_ =
                 (long)&(this->_workSol)._primal.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[0xffffffffffffffff].m_backend.
                        m_value.num.m_backend.
                        super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                        .m_data + lVar20;
            local_80._8_8_ =
                 (long)&(this->_rationalLP->
                        super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                        ).up.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.m_value.num.
                        m_backend.
                        super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                        .m_data + lVar20;
            boost::multiprecision::
            number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
            ::
            number<boost::multiprecision::detail::subtract_immediates,boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>,boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>,void,void>
                      ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
                        *)&local_e8.ld,
                       (expression<boost::multiprecision::detail::subtract_immediates,_boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_void,_void>
                        *)local_80,(type *)0x0);
            boost::multiprecision::backends::
            rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
            ::str_abi_cxx11_(&local_108,
                             (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
                              *)&local_e8.ld,0,~(_S_ios_fmtflags_min|_S_ios_fmtflags_max));
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_108._M_dataplus._M_p != &local_108.field_2) {
              operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1
                             );
            }
            if ((local_b3 == '\0') && (local_b2 == '\0')) {
              operator_delete(local_c0,(ulong)local_c8 << 3);
            }
            if ((local_d8._M_local_buf[5] == '\0') && (local_d8._M_local_buf[6] == '\0')) {
              operator_delete(local_e8.ld.data,(ulong)local_e8.ld.capacity << 3);
            }
            VVar16 = (this->spxout).m_verbosity;
            if (2 < (int)VVar16) {
              (this->spxout).m_verbosity = INFO1;
              soplex::operator<<(&this->spxout,"Reconstructed solution primal infeasible (2).\n");
              goto LAB_0035e827;
            }
            goto LAB_0035e82a;
          }
          lVar17 = lVar18 + -1;
          lVar14 = lVar18 + -3;
          bVar19 = lVar17 < 2;
          lVar18 = lVar17;
          lVar20 = lVar20 + -0x40;
        } while (SBORROW8(lVar17,2) == lVar14 < 0);
      }
      if ((bVar19 & 1) != 0) {
        local_a0 = &(this->_workSol)._slacks;
        VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
        ::reDim(local_a0,(this->_rationalLP->
                         super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                         ).
                         super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                         .set.thenum,true);
        (*(this->_rationalLP->
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
          .
          super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
          ._vptr_ClassArray[0x46])(this->_rationalLP,local_98,local_a0,1);
        lVar20 = (long)(this->_rationalLP->
                       super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                       ).
                       super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                       .set.thenum;
        bVar10 = lVar20 < 1;
        if (0 < lVar20) {
          lVar18 = lVar20 + 1;
          lVar20 = lVar20 << 6;
          do {
            pVVar5 = (this->_basisStatusRows).data;
            if ((((pVVar5[lVar18 + -2] == FIXED) &&
                 (iVar11 = boost::multiprecision::backends::
                           rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                           ::compare((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                      *)((long)&(this->_workSol)._slacks.val.
                                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start[-1].
                                                m_backend.m_value.num.m_backend.
                                                super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                                .m_data + lVar20),
                                     (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                      *)((long)&(this->_rationalLP->
                                                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                                                ).left.val.
                                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start[-1].
                                                m_backend.m_value.num.m_backend.
                                                super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                                .m_data + lVar20)), iVar11 != 0)) ||
                ((pVVar5[lVar18 + -2] == ON_LOWER &&
                 (iVar11 = boost::multiprecision::backends::
                           rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                           ::compare((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                      *)((long)&(this->_workSol)._slacks.val.
                                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start[-1].
                                                m_backend.m_value.num.m_backend.
                                                super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                                .m_data + lVar20),
                                     (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                      *)((long)&(this->_rationalLP->
                                                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                                                ).left.val.
                                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start[-1].
                                                m_backend.m_value.num.m_backend.
                                                super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                                .m_data + lVar20)), iVar11 != 0)))) ||
               ((pVVar5[lVar18 + -2] == ON_UPPER &&
                (iVar11 = boost::multiprecision::backends::
                          rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                          ::compare((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                     *)((long)&(this->_workSol)._slacks.val.
                                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start[-1].
                                               m_backend.m_value.num.m_backend.
                                               super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                               .m_data + lVar20),
                                    (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                     *)((long)&(this->_rationalLP->
                                               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                                               ).right.val.
                                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start[-1].
                                               m_backend.m_value.num.m_backend.
                                               super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                               .m_data + lVar20)), iVar11 != 0)))) {
LAB_0035e9dd:
              bVar9 = false;
            }
            else {
              if (pVVar5[lVar18 + -2] == ZERO) {
                pnVar6 = (local_a0->val).
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                local_108._M_dataplus._M_p = (pointer)0x0;
                boost::multiprecision::backends::
                rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                ::rational_adaptor<long_long>
                          ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                            *)&local_e8.ld,(longlong *)&local_108,(type *)0x0);
                iVar11 = boost::multiprecision::backends::
                         rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                         ::compare((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                    *)((long)&pnVar6[-1].m_backend.m_value.num.m_backend.
                                              super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                              .m_data + lVar20),
                                   (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                    *)&local_e8.ld);
                if ((local_b3 == '\0') && (local_b2 == '\0')) {
                  operator_delete(local_c0,(ulong)local_c8 << 3);
                }
                if ((local_d8._M_local_buf[5] == '\0') && (local_d8._M_local_buf[6] == '\0')) {
                  operator_delete(local_e8.ld.data,(ulong)local_e8.ld.capacity << 3);
                }
                if (iVar11 != 0) goto LAB_0035e9dd;
              }
              if (pVVar5[lVar18 + -2] == UNDEFINED) goto LAB_0035e9dd;
            }
            RVar3 = (this->_rowTypes).data[lVar18 + -2];
            if (((RVar3 < (RANGETYPE_FIXED|RANGETYPE_LOWER)) && ((0x1aU >> (RVar3 & 0x1f) & 1) != 0)
                ) && (iVar11 = boost::multiprecision::backends::
                               rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                               ::compare((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                          *)((long)&(this->_workSol)._slacks.val.
                                                                                                        
                                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[-1].
                                                  m_backend.m_value.num.m_backend.
                                                  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                                  .m_data + lVar20),
                                         (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                          *)((long)&(this->_rationalLP->
                                                                                                        
                                                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                                                  ).left.val.
                                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[-1].
                                                  m_backend.m_value.num.m_backend.
                                                  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                                  .m_data + lVar20)), iVar11 < 0)) {
              local_80._0_8_ =
                   (long)&(this->_rationalLP->
                          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                          ).left.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.m_value.num.
                          m_backend.
                          super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                          .m_data + lVar20;
              local_80._8_8_ =
                   (long)&(this->_workSol)._slacks.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.m_value.num.
                          m_backend.
                          super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                          .m_data + lVar20;
              boost::multiprecision::
              number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
              ::
              number<boost::multiprecision::detail::subtract_immediates,boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>,boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>,void,void>
                        ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
                          *)&local_e8.ld,
                         (expression<boost::multiprecision::detail::subtract_immediates,_boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_void,_void>
                          *)local_80,(type *)0x0);
              boost::multiprecision::backends::
              rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
              ::str_abi_cxx11_(&local_108,
                               (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
                                *)&local_e8.ld,0,~(_S_ios_fmtflags_min|_S_ios_fmtflags_max));
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p != &local_108.field_2) {
                operator_delete(local_108._M_dataplus._M_p,
                                local_108.field_2._M_allocated_capacity + 1);
              }
              boost::multiprecision::
              number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
              ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                         *)&local_e8.ld);
              VVar16 = (this->spxout).m_verbosity;
              if (2 < (int)VVar16) {
                (this->spxout).m_verbosity = INFO1;
                soplex::operator<<(&this->spxout,"Reconstructed solution primal infeasible (3).\n");
LAB_0035eb8f:
                (this->spxout).m_verbosity = VVar16;
              }
LAB_0035eb92:
              (*this->_statistics->reconstructionTime->_vptr_Timer[4])();
              break;
            }
            if (((this->_rowTypes).data[lVar18 + -2] - RANGETYPE_UPPER < 3) &&
               (iVar11 = boost::multiprecision::backends::
                         rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                         ::compare((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                    *)((long)&(this->_workSol)._slacks.val.
                                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start[-1].
                                              m_backend.m_value.num.m_backend.
                                              super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                              .m_data + lVar20),
                                   (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                    *)((long)&(this->_rationalLP->
                                              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                                              ).right.val.
                                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start[-1].
                                              m_backend.m_value.num.m_backend.
                                              super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                              .m_data + lVar20)), 0 < iVar11)) {
              local_80._0_8_ =
                   (long)&(this->_workSol)._slacks.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.m_value.num.
                          m_backend.
                          super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                          .m_data + lVar20;
              local_80._8_8_ =
                   (long)&(this->_rationalLP->
                          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                          ).right.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.m_value.num.
                          m_backend.
                          super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                          .m_data + lVar20;
              boost::multiprecision::
              number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
              ::
              number<boost::multiprecision::detail::subtract_immediates,boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>,boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>,void,void>
                        ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
                          *)&local_e8.ld,
                         (expression<boost::multiprecision::detail::subtract_immediates,_boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_void,_void>
                          *)local_80,(type *)0x0);
              boost::multiprecision::backends::
              rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
              ::str_abi_cxx11_(&local_108,
                               (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
                                *)&local_e8.ld,0,~(_S_ios_fmtflags_min|_S_ios_fmtflags_max));
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p != &local_108.field_2) {
                operator_delete(local_108._M_dataplus._M_p,
                                local_108.field_2._M_allocated_capacity + 1);
              }
              boost::multiprecision::
              number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
              ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                         *)&local_e8.ld);
              VVar16 = (this->spxout).m_verbosity;
              if (2 < (int)VVar16) {
                (this->spxout).m_verbosity = INFO1;
                soplex::operator<<(&this->spxout,"Reconstructed solution primal infeasible (4).\n");
                goto LAB_0035eb8f;
              }
              goto LAB_0035eb92;
            }
            lVar17 = lVar18 + -1;
            lVar14 = lVar18 + -3;
            bVar10 = lVar17 < 2;
            lVar18 = lVar17;
            lVar20 = lVar20 + -0x40;
          } while (SBORROW8(lVar17,2) == lVar14 < 0);
        }
        if (bVar10) {
          pVVar1 = &local_88->_dual;
          this_01 = &(this->_workSol)._dual;
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
          ::operator=(this_01,pVVar1);
          bVar10 = reconstructVector(this_01,local_a8,(DIdxSet *)0x0);
          if (!bVar10) {
            VVar16 = (this->spxout).m_verbosity;
            if (2 < (int)VVar16) {
              (this->spxout).m_verbosity = INFO1;
              soplex::operator<<(&this->spxout,"Rational reconstruction of dual solution failed.\n")
              ;
              goto LAB_0035e67d;
            }
            goto LAB_0035e680;
          }
          iVar11 = this->_currentSettings->_intParamValues[0];
          local_a8 = (Rational *)CONCAT44(local_a8._4_4_,iVar11);
          lVar20 = (long)(this->_rationalLP->
                         super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                         ).
                         super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                         .set.thenum;
          local_90 = &this->spxout;
          lVar18 = lVar20 << 6;
          local_60 = pVVar1;
          do {
            lVar14 = lVar20;
            if (lVar14 < 1) break;
            pnVar6 = (this_01->val).
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            if (*(int *)((long)&pnVar6[-1].m_backend.m_value.num.m_backend.
                                super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                .m_limbs + lVar18) == 1) {
              if ((&pnVar6[-1].m_backend.m_value.num.m_backend.
                    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                    .m_internal)[lVar18] == false) {
                plVar15 = *(long **)((long)&pnVar6[-1].m_backend.m_value.num.m_backend.
                                            super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                            .m_data + lVar18 + 8);
              }
              else {
                plVar15 = (long *)((long)&pnVar6[-1].m_backend.m_value.num.m_backend.
                                          super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                          .m_data + lVar18);
              }
              if (*plVar15 != 0) goto LAB_0035ec4f;
              uVar12 = 0;
            }
            else {
LAB_0035ec4f:
              uVar12 = -(uint)(&pnVar6[-1].m_backend.m_value.num.m_backend.
                                super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                .m_sign)[lVar18] | 1;
            }
            if (((int)uVar12 < 1 || iVar11 == 1) && (((int)local_a8 != 1 || (-1 < (int)uVar12)))) {
              bVar7 = (int)uVar12 < 0;
              if ((int)local_a8 == 1) {
                bVar7 = 0 < (int)uVar12;
              }
              bVar10 = true;
              if (bVar7) {
                if ((2 < (this->_rowTypes).data[lVar14 + -1] - RANGETYPE_UPPER) ||
                   (iVar13 = boost::multiprecision::backends::
                             rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                             ::compare((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                        *)((long)&(this->_workSol)._slacks.val.
                                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[-1].
                                                  m_backend.m_value.num.m_backend.
                                                  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                                  .m_data + lVar18),
                                       (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                        *)((long)&(this->_rationalLP->
                                                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                                                  ).right.val.
                                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[-1].
                                                  m_backend.m_value.num.m_backend.
                                                  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                                  .m_data + lVar18)), iVar13 < 0)) {
                  boost::multiprecision::backends::
                  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
                  ::str_abi_cxx11_((string *)&local_e8.ld,
                                   (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
                                    *)((long)&(this_01->val).
                                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start[-1].
                                              m_backend.m_value.num.m_backend.
                                              super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                              .m_data + lVar18),0,
                                   ~(_S_ios_fmtflags_min|_S_ios_fmtflags_max));
                  boost::multiprecision::backends::
                  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
                  ::str_abi_cxx11_(&local_108,
                                   (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
                                    *)((long)&(local_a0->val).
                                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start[-1].
                                              m_backend.m_value.num.m_backend.
                                              super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                              .m_data + lVar18),0,
                                   ~(_S_ios_fmtflags_min|_S_ios_fmtflags_max));
                  boost::multiprecision::backends::
                  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
                  ::str_abi_cxx11_((string *)local_80,
                                   (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
                                    *)((long)&(this->_rationalLP->
                                              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                                              ).right.val.
                                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start[-1].
                                              m_backend.m_value.num.m_backend.
                                              super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                              .m_data + lVar18),0,
                                   ~(_S_ios_fmtflags_min|_S_ios_fmtflags_max));
                  if ((type)local_80._0_8_ != (type)(local_80 + 0x10)) {
                    operator_delete((void *)local_80._0_8_,local_80._16_8_ + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_108._M_dataplus._M_p != &local_108.field_2) {
                    operator_delete(local_108._M_dataplus._M_p,
                                    local_108.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_e8.la[0]._4_4_,local_e8.ld.capacity) != &local_d8) {
                    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)CONCAT44(local_e8.la[0]._4_4_,local_e8.ld.capacity),
                                    CONCAT17(local_d8._M_local_buf[7],
                                             CONCAT16(local_d8._M_local_buf[6],
                                                      CONCAT15(local_d8._M_local_buf[5],
                                                               local_d8._M_allocated_capacity._0_5_)
                                                     )) + 1);
                  }
                  VVar16 = (this->spxout).m_verbosity;
                  if (2 < (int)VVar16) {
                    (this->spxout).m_verbosity = INFO1;
                    soplex::operator<<(local_90,"Reconstructed solution dual infeasible (2).\n");
                    goto LAB_0035ed88;
                  }
                  goto LAB_0035ed8b;
                }
                pVVar5 = (this->_basisStatusRows).data;
                switch(pVVar5[lVar14 + -1]) {
                case ON_UPPER:
                case FIXED:
                  break;
                default:
                  pVVar5[lVar14 + -1] = ON_UPPER;
                  break;
                case BASIC:
                case UNDEFINED:
switchD_0035ee2a_caseD_4:
                  bVar10 = true;
                  bVar9 = false;
                }
              }
            }
            else {
              RVar3 = (this->_rowTypes).data[lVar14 + -1];
              if ((RVar3 < (RANGETYPE_FIXED|RANGETYPE_LOWER)) &&
                 (((0x1aU >> (RVar3 & 0x1f) & 1) != 0 &&
                  (iVar13 = boost::multiprecision::backends::
                            rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                            ::compare((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                       *)((long)&(this->_workSol)._slacks.val.
                                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start[-1].
                                                 m_backend.m_value.num.m_backend.
                                                 super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                                 .m_data + lVar18),
                                      (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                       *)((long)&(this->_rationalLP->
                                                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                                                 ).left.val.
                                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start[-1].
                                                 m_backend.m_value.num.m_backend.
                                                 super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                                 .m_data + lVar18)), iVar13 < 1)))) {
                pVVar5 = (this->_basisStatusRows).data;
                VVar4 = pVVar5[lVar14 + -1];
                bVar10 = true;
                if (1 < VVar4 - ON_LOWER) {
                  if ((VVar4 == BASIC) || (VVar4 == UNDEFINED)) goto switchD_0035ee2a_caseD_4;
                  pVVar5[lVar14 + -1] = ON_LOWER;
                }
              }
              else {
                boost::multiprecision::backends::
                rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
                ::str_abi_cxx11_((string *)&local_e8.ld,
                                 (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
                                  *)((long)&(this_01->val).
                                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.
                                            m_value.num.m_backend.
                                            super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                            .m_data + lVar18),0,
                                 ~(_S_ios_fmtflags_min|_S_ios_fmtflags_max));
                boost::multiprecision::backends::
                rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
                ::str_abi_cxx11_(&local_108,
                                 (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
                                  *)((long)&(local_a0->val).
                                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.
                                            m_value.num.m_backend.
                                            super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                            .m_data + lVar18),0,
                                 ~(_S_ios_fmtflags_min|_S_ios_fmtflags_max));
                boost::multiprecision::backends::
                rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
                ::str_abi_cxx11_((string *)local_80,
                                 (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
                                  *)((long)&(this->_rationalLP->
                                            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                                            ).left.val.
                                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.
                                            m_value.num.m_backend.
                                            super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                            .m_data + lVar18),0,
                                 ~(_S_ios_fmtflags_min|_S_ios_fmtflags_max));
                if ((type)local_80._0_8_ != (type)(local_80 + 0x10)) {
                  operator_delete((void *)local_80._0_8_,local_80._16_8_ + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_108._M_dataplus._M_p != &local_108.field_2) {
                  operator_delete(local_108._M_dataplus._M_p,
                                  local_108.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(local_e8.la[0]._4_4_,local_e8.ld.capacity) != &local_d8) {
                  operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)CONCAT44(local_e8.la[0]._4_4_,local_e8.ld.capacity),
                                  CONCAT17(local_d8._M_local_buf[7],
                                           CONCAT16(local_d8._M_local_buf[6],
                                                    CONCAT15(local_d8._M_local_buf[5],
                                                             local_d8._M_allocated_capacity._0_5_)))
                                  + 1);
                }
                VVar16 = (this->spxout).m_verbosity;
                if (2 < (int)VVar16) {
                  (this->spxout).m_verbosity = INFO1;
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((this->spxout).m_streams[3],
                             "Reconstructed solution dual infeasible (1).\n",0x2c);
LAB_0035ed88:
                  (this->spxout).m_verbosity = VVar16;
                }
LAB_0035ed8b:
                (*this->_statistics->reconstructionTime->_vptr_Timer[4])();
                bVar10 = false;
              }
            }
            lVar20 = lVar14 + -1;
            lVar18 = lVar18 + -0x40;
          } while (bVar10);
          if (lVar14 < 1) {
            pVVar1 = &(this->_workSol)._redCost;
            VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
            ::reDim(pVVar1,(this->_rationalLP->
                           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                           ).
                           super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                           .set.thenum,true);
            SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
            ::getObj(this->_rationalLP,pVVar1);
            (*(this->_rationalLP->
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
              .
              super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
              ._vptr_ClassArray[0x4a])(this->_rationalLP,this_01,pVVar1);
            bVar10 = (int)local_a8 == 1;
            lVar20 = (long)(this->_rationalLP->
                           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                           ).
                           super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                           .set.thenum;
            lVar18 = lVar20 << 6;
            do {
              lVar14 = lVar20;
              if (lVar14 < 1) break;
              pnVar6 = (pVVar1->val).
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              if (*(int *)((long)&pnVar6[-1].m_backend.m_value.num.m_backend.
                                  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                  .m_limbs + lVar18) == 1) {
                if ((&pnVar6[-1].m_backend.m_value.num.m_backend.
                      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                      .m_internal)[lVar18] == false) {
                  plVar15 = *(long **)((long)&pnVar6[-1].m_backend.m_value.num.m_backend.
                                              super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                              .m_data + lVar18 + 8);
                }
                else {
                  plVar15 = (long *)((long)&pnVar6[-1].m_backend.m_value.num.m_backend.
                                            super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                            .m_data + lVar18);
                }
                if (*plVar15 != 0) goto LAB_0035f02c;
                uVar12 = 0;
              }
              else {
LAB_0035f02c:
                uVar12 = -(uint)(&pnVar6[-1].m_backend.m_value.num.m_backend.
                                  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                  .m_sign)[lVar18] | 1;
              }
              if ((bVar10 || (int)uVar12 < 1) && (((int)local_a8 != 1 || (-1 < (int)uVar12)))) {
                bVar8 = (int)uVar12 < 0;
                if ((int)local_a8 == 1) {
                  bVar8 = 0 < (int)uVar12;
                }
                bVar7 = true;
                if (bVar8) {
                  if ((2 < (this->_colTypes).data[lVar14 + -1] - RANGETYPE_UPPER) ||
                     (iVar11 = boost::multiprecision::backends::
                               rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                               ::compare((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                          *)((long)&(this->_workSol)._primal.val.
                                                                                                        
                                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start
                                                  [0xffffffffffffffff].m_backend.m_value.num.
                                                  m_backend.
                                                  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                                  .m_data + lVar18),
                                         (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                          *)((long)&(this->_rationalLP->
                                                                                                        
                                                  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                                                  ).up.val.
                                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[-1].
                                                  m_backend.m_value.num.m_backend.
                                                  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                                  .m_data + lVar18)), iVar11 < 0)) {
                    boost::multiprecision::backends::
                    rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
                    ::str_abi_cxx11_((string *)&local_e8.ld,
                                     (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
                                      *)((long)&(pVVar1->val).
                                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start[-1].
                                                m_backend.m_value.num.m_backend.
                                                super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                                .m_data + lVar18),0,
                                     ~(_S_ios_fmtflags_min|_S_ios_fmtflags_max));
                    boost::multiprecision::backends::
                    rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
                    ::str_abi_cxx11_(&local_108,
                                     (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
                                      *)((long)&(local_98->_primal).val.
                                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start
                                                [0xffffffffffffffff].m_backend.m_value.num.m_backend
                                                .
                                                super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                                .m_data + lVar18),0,
                                     ~(_S_ios_fmtflags_min|_S_ios_fmtflags_max));
                    boost::multiprecision::backends::
                    rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
                    ::str_abi_cxx11_((string *)local_80,
                                     (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
                                      *)((long)&(this->_rationalLP->
                                                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                                                ).up.val.
                                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start[-1].
                                                m_backend.m_value.num.m_backend.
                                                super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                                .m_data + lVar18),0,
                                     ~(_S_ios_fmtflags_min|_S_ios_fmtflags_max));
                    if ((type)local_80._0_8_ != (type)(local_80 + 0x10)) {
                      operator_delete((void *)local_80._0_8_,local_80._16_8_ + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_108._M_dataplus._M_p != &local_108.field_2) {
                      operator_delete(local_108._M_dataplus._M_p,
                                      local_108.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT44(local_e8.la[0]._4_4_,local_e8.ld.capacity) != &local_d8) {
                      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)CONCAT44(local_e8.la[0]._4_4_,local_e8.ld.capacity),
                                      CONCAT17(local_d8._M_local_buf[7],
                                               CONCAT16(local_d8._M_local_buf[6],
                                                        CONCAT15(local_d8._M_local_buf[5],
                                                                 local_d8._M_allocated_capacity.
                                                                 _0_5_))) + 1);
                    }
                    VVar16 = (this->spxout).m_verbosity;
                    if (2 < (int)VVar16) {
                      (this->spxout).m_verbosity = INFO1;
                      soplex::operator<<(local_90,"Reconstructed solution dual infeasible (4).\n");
                      goto LAB_0035f16b;
                    }
                    goto LAB_0035f16e;
                  }
                  pVVar5 = (this->_basisStatusCols).data;
                  switch(pVVar5[lVar14 + -1]) {
                  case ON_UPPER:
                  case FIXED:
                    break;
                  default:
                    pVVar5[lVar14 + -1] = ON_UPPER;
                    break;
                  case BASIC:
                  case UNDEFINED:
switchD_0035f20d_caseD_4:
                    bVar7 = true;
                    bVar9 = false;
                  }
                }
              }
              else {
                RVar3 = (this->_colTypes).data[lVar14 + -1];
                if ((RVar3 < (RANGETYPE_FIXED|RANGETYPE_LOWER)) &&
                   (((0x1aU >> (RVar3 & 0x1f) & 1) != 0 &&
                    (iVar11 = boost::multiprecision::backends::
                              rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                              ::compare((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                         *)((long)&(this->_workSol)._primal.val.
                                                                                                      
                                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start
                                                  [0xffffffffffffffff].m_backend.m_value.num.
                                                  m_backend.
                                                  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                                  .m_data + lVar18),
                                        (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                         *)((long)&(this->_rationalLP->
                                                                                                      
                                                  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                                                  ).low.val.
                                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[-1].
                                                  m_backend.m_value.num.m_backend.
                                                  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                                  .m_data + lVar18)), iVar11 < 1)))) {
                  pVVar5 = (this->_basisStatusCols).data;
                  VVar4 = pVVar5[lVar14 + -1];
                  bVar7 = true;
                  if (1 < VVar4 - ON_LOWER) {
                    if ((VVar4 == BASIC) || (VVar4 == UNDEFINED)) goto switchD_0035f20d_caseD_4;
                    pVVar5[lVar14 + -1] = ON_LOWER;
                  }
                }
                else {
                  boost::multiprecision::backends::
                  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
                  ::str_abi_cxx11_((string *)&local_e8.ld,
                                   (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
                                    *)((long)&(pVVar1->val).
                                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start[-1].
                                              m_backend.m_value.num.m_backend.
                                              super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                              .m_data + lVar18),0,
                                   ~(_S_ios_fmtflags_min|_S_ios_fmtflags_max));
                  boost::multiprecision::backends::
                  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
                  ::str_abi_cxx11_(&local_108,
                                   (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
                                    *)((long)&(local_98->_primal).val.
                                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start
                                              [0xffffffffffffffff].m_backend.m_value.num.m_backend.
                                              super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                              .m_data + lVar18),0,
                                   ~(_S_ios_fmtflags_min|_S_ios_fmtflags_max));
                  boost::multiprecision::backends::
                  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
                  ::str_abi_cxx11_((string *)local_80,
                                   (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
                                    *)((long)&(this->_rationalLP->
                                              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                                              ).low.val.
                                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start[-1].
                                              m_backend.m_value.num.m_backend.
                                              super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                              .m_data + lVar18),0,
                                   ~(_S_ios_fmtflags_min|_S_ios_fmtflags_max));
                  if ((type)local_80._0_8_ != (type)(local_80 + 0x10)) {
                    operator_delete((void *)local_80._0_8_,local_80._16_8_ + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_108._M_dataplus._M_p != &local_108.field_2) {
                    operator_delete(local_108._M_dataplus._M_p,
                                    local_108.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_e8.la[0]._4_4_,local_e8.ld.capacity) != &local_d8) {
                    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)CONCAT44(local_e8.la[0]._4_4_,local_e8.ld.capacity),
                                    CONCAT17(local_d8._M_local_buf[7],
                                             CONCAT16(local_d8._M_local_buf[6],
                                                      CONCAT15(local_d8._M_local_buf[5],
                                                               local_d8._M_allocated_capacity._0_5_)
                                                     )) + 1);
                  }
                  VVar16 = (this->spxout).m_verbosity;
                  if (2 < (int)VVar16) {
                    (this->spxout).m_verbosity = INFO1;
                    soplex::operator<<(local_90,"Reconstructed solution dual infeasible (3).\n");
LAB_0035f16b:
                    (this->spxout).m_verbosity = VVar16;
                  }
LAB_0035f16e:
                  (*this->_statistics->reconstructionTime->_vptr_Timer[4])();
                  bVar7 = false;
                }
              }
              lVar20 = lVar14 + -1;
              lVar18 = lVar18 + -0x40;
            } while (bVar7);
            if (lVar14 < 1) {
              VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
              ::operator=(&local_88->_primal,&local_98->_primal);
              VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
              ::operator=(&local_88->_slacks,local_a0);
              VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
              ::operator=(local_60,this_01);
              VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
              ::operator=(&local_88->_redCost,pVVar1);
              if (!bVar9) {
                VVar16 = (this->spxout).m_verbosity;
                if (0 < (int)VVar16) {
                  (this->spxout).m_verbosity = WARNING;
                  soplex::operator<<(local_90,"Warning: Reconstructed solution not basic.\n");
                  (this->spxout).m_verbosity = VVar16;
                }
                this->_hasBasis = false;
              }
              bVar9 = true;
              (*this->_statistics->reconstructionTime->_vptr_Timer[4])();
              goto LAB_0035f34b;
            }
          }
        }
      }
    }
    else {
      VVar16 = (this->spxout).m_verbosity;
      if (2 < (int)VVar16) {
        (this->spxout).m_verbosity = INFO1;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((this->spxout).m_streams[3],
                   "Rational reconstruction of primal solution failed.\n",0x33);
LAB_0035e67d:
        (this->spxout).m_verbosity = VVar16;
      }
LAB_0035e680:
      (*this->_statistics->reconstructionTime->_vptr_Timer[4])();
    }
  }
  bVar9 = false;
LAB_0035f34b:
  DIdxSet::~DIdxSet(&local_50);
  return bVar9;
}

Assistant:

bool SoPlexBase<R>::_reconstructSolutionRational(SolRational& sol,
      DataArray< typename SPxSolverBase<R>::VarStatus >& basisStatusRows,
      DataArray< typename SPxSolverBase<R>::VarStatus >& basisStatusCols,
      const Rational& denomBoundSquared)
{
   bool success;
   bool isSolBasic;
   DIdxSet basicIndices(numColsRational());

   success = false;
   isSolBasic = true;

   if(!sol.isPrimalFeasible() || !sol.isDualFeasible())
      return success;

   // start timing and increment statistics counter
   _statistics->reconstructionTime->start();
   _statistics->rationalReconstructions++;

   // reconstruct primal vector
   _workSol._primal = sol._primal;

   for(int j = 0; j < numColsRational(); ++j)
   {
      if(basisStatusCols[j] == SPxSolverBase<R>::BASIC)
         basicIndices.addIdx(j);
   }

   success = reconstructVector(_workSol._primal, denomBoundSquared, &basicIndices);

   if(!success)
   {
      SPX_MSG_INFO1(spxout, spxout << "Rational reconstruction of primal solution failed.\n");
      _statistics->reconstructionTime->stop();
      return success;
   }

   SPxOut::debug(this, "Rational reconstruction of primal solution successful.\n");

   // check violation of bounds
   for(int c = numColsRational() - 1; c >= 0; c--)
   {
      // we want to notify the user whether the reconstructed solution is basic; otherwise, this would be redundant
      typename SPxSolverBase<R>::VarStatus& basisStatusCol = _basisStatusCols[c];

      if((basisStatusCol == SPxSolverBase<R>::FIXED && _workSol._primal[c] != lowerRational(c))
            || (basisStatusCol == SPxSolverBase<R>::ON_LOWER && _workSol._primal[c] != lowerRational(c))
            || (basisStatusCol == SPxSolverBase<R>::ON_UPPER && _workSol._primal[c] != upperRational(c))
            || (basisStatusCol == SPxSolverBase<R>::ZERO && _workSol._primal[c] != 0)
            || (basisStatusCol == SPxSolverBase<R>::UNDEFINED))
      {
         isSolBasic = false;
      }

      if(_lowerFinite(_colTypes[c]) && _workSol._primal[c] < lowerRational(c))
      {
         SPxOut::debug(this, "Lower bound of variable {} violated by {}\n",
                       c, (static_cast<Rational>(lowerRational(c) - _workSol._primal[c])).str());
         SPX_MSG_INFO1(spxout, spxout << "Reconstructed solution primal infeasible (1).\n");
         _statistics->reconstructionTime->stop();
         return false;
      }

      if(_upperFinite(_colTypes[c]) && _workSol._primal[c] > upperRational(c))
      {
         SPxOut::debug(this, "Upper bound of variable {} violated by {}\n",
                       c, (static_cast<Rational>(_workSol._primal[c] - upperRational(c))).str());
         SPX_MSG_INFO1(spxout, spxout << "Reconstructed solution primal infeasible (2).\n");
         _statistics->reconstructionTime->stop();
         return false;
      }
   }

   // compute slacks
   ///@todo we should compute them one by one so we can abort when encountering an infeasibility
   _workSol._slacks.reDim(numRowsRational());
   _rationalLP->computePrimalActivity(_workSol._primal, _workSol._slacks);

   // check violation of sides
   for(int r = numRowsRational() - 1; r >= 0; r--)
   {
      // we want to notify the user whether the reconstructed solution is basic; otherwise, this would be redundant
      typename SPxSolverBase<R>::VarStatus& basisStatusRow = _basisStatusRows[r];

      if((basisStatusRow == SPxSolverBase<R>::FIXED && _workSol._slacks[r] != lhsRational(r))
            || (basisStatusRow == SPxSolverBase<R>::ON_LOWER && _workSol._slacks[r] != lhsRational(r))
            || (basisStatusRow == SPxSolverBase<R>::ON_UPPER && _workSol._slacks[r] != rhsRational(r))
            || (basisStatusRow == SPxSolverBase<R>::ZERO && _workSol._slacks[r] != 0)
            || (basisStatusRow == SPxSolverBase<R>::UNDEFINED))
      {
         isSolBasic = false;
      }

      if(_lowerFinite(_rowTypes[r]) && _workSol._slacks[r] < lhsRational(r))
      {
         SPxOut::debug(this, "Lhs of row {} violated by {}\n",
                       r, (static_cast<Rational>(lhsRational(r) - _workSol._slacks[r])).str());
         SPX_MSG_INFO1(spxout, spxout << "Reconstructed solution primal infeasible (3).\n");
         _statistics->reconstructionTime->stop();
         return false;
      }

      if(_upperFinite(_rowTypes[r]) && _workSol._slacks[r] > rhsRational(r))
      {
         SPxOut::debug(this, "Rhs of row {} violated by {}\n",
                       r, (static_cast<Rational>(_workSol._slacks[r] - rhsRational(r))).str());
         SPX_MSG_INFO1(spxout, spxout << "Reconstructed solution primal infeasible (4).\n");
         _statistics->reconstructionTime->stop();
         return false;
      }
   }

   // reconstruct dual vector
   _workSol._dual = sol._dual;

   success = reconstructVector(_workSol._dual, denomBoundSquared);

   if(!success)
   {
      SPX_MSG_INFO1(spxout, spxout << "Rational reconstruction of dual solution failed.\n");
      _statistics->reconstructionTime->stop();
      return success;
   }

   SPxOut::debug(this, "Rational reconstruction of dual vector successful.\n");

   // check dual multipliers before reduced costs because this check is faster since it does not require the
   // computation of reduced costs
   const bool maximizing = (intParam(SoPlexBase<R>::OBJSENSE) == SoPlexBase<R>::OBJSENSE_MAXIMIZE);

   for(int r = numRowsRational() - 1; r >= 0; r--)
   {
      int sig = sign(_workSol._dual[r]);

      if((!maximizing && sig > 0) || (maximizing && sig < 0))
      {
         if(!_lowerFinite(_rowTypes[r]) || _workSol._slacks[r] > lhsRational(r))
         {
            SPxOut::debug(this,
                          "complementary slackness violated by row {} with dual {} and slack {} not at lhs {}\n",
                          r, _workSol._dual[r].str(), _workSol._slacks[r].str(), lhsRational(r).str());
            SPX_MSG_INFO1(spxout, spxout << "Reconstructed solution dual infeasible (1).\n");
            _statistics->reconstructionTime->stop();
            return false;
         }

         if(_basisStatusRows[r] != SPxSolverBase<R>::ON_LOWER
               && _basisStatusRows[r] != SPxSolverBase<R>::FIXED)
         {
            if(_basisStatusRows[r] == SPxSolverBase<R>::BASIC
                  || _basisStatusRows[r] == SPxSolverBase<R>::UNDEFINED)
               isSolBasic = false;
            else
               _basisStatusRows[r] = SPxSolverBase<R>::ON_LOWER;
         }
      }
      else if((!maximizing && sig < 0) || (maximizing && sig > 0))
      {
         if(!_upperFinite(_rowTypes[r]) || _workSol._slacks[r] < rhsRational(r))
         {
            SPxOut::debug(this,
                          "complementary slackness violated by row {} with dual {} and slack {} not at rhs {}\n",
                          r, _workSol._dual[r].str(), _workSol._slacks[r].str(), rhsRational(r).str());
            SPX_MSG_INFO1(spxout, spxout << "Reconstructed solution dual infeasible (2).\n");
            _statistics->reconstructionTime->stop();
            return false;
         }

         if(_basisStatusRows[r] != SPxSolverBase<R>::ON_UPPER
               && _basisStatusRows[r] != SPxSolverBase<R>::FIXED)
         {
            if(_basisStatusRows[r] == SPxSolverBase<R>::BASIC
                  || _basisStatusRows[r] == SPxSolverBase<R>::UNDEFINED)
               isSolBasic = false;
            else
               _basisStatusRows[r] = SPxSolverBase<R>::ON_UPPER;
         }
      }
   }

   // compute reduced cost vector; we assume that the objective function vector has less nonzeros than the reduced
   // cost vector, and so multiplying with -1 first and subtracting the dual activity should be faster than adding
   // the dual activity and negating afterwards
   ///@todo we should compute them one by one so we can abort when encountering an infeasibility
   _workSol._redCost.reDim(numColsRational());
   _rationalLP->getObj(_workSol._redCost);
   _rationalLP->subDualActivity(_workSol._dual, _workSol._redCost);

   // check reduced cost violation
   for(int c = numColsRational() - 1; c >= 0; c--)
   {
      int sig = sign(_workSol._redCost[c]);

      if((!maximizing && sig > 0) || (maximizing && sig < 0))
      {
         if(!_lowerFinite(_colTypes[c]) || _workSol._primal[c] > lowerRational(c))
         {
            SPxOut::debug(this,
                          "complementary slackness violated by column {} with reduced cost {} and value {} not at lower bound {}\n",
                          c, _workSol._redCost[c].str(), _workSol._primal[c].str(), lowerRational(c).str());
            SPX_MSG_INFO1(spxout, spxout << "Reconstructed solution dual infeasible (3).\n");
            _statistics->reconstructionTime->stop();
            return false;
         }

         if(_basisStatusCols[c] != SPxSolverBase<R>::ON_LOWER
               && _basisStatusCols[c] != SPxSolverBase<R>::FIXED)
         {
            if(_basisStatusCols[c] == SPxSolverBase<R>::BASIC
                  || _basisStatusCols[c] == SPxSolverBase<R>::UNDEFINED)
               isSolBasic = false;
            else
               _basisStatusCols[c] = SPxSolverBase<R>::ON_LOWER;
         }
      }
      else if((!maximizing && sig < 0) || (maximizing && sig > 0))
      {
         if(!_upperFinite(_colTypes[c]) || _workSol._primal[c] < upperRational(c))
         {
            SPxOut::debug(this,
                          "complementary slackness violated by column {} with reduced cost {} and value {} not at upper bound {}\n",
                          c, _workSol._redCost[c].str(), _workSol._primal[c].str(), upperRational(c).str());
            SPX_MSG_INFO1(spxout, spxout << "Reconstructed solution dual infeasible (4).\n");
            _statistics->reconstructionTime->stop();
            return false;
         }

         if(_basisStatusCols[c] != SPxSolverBase<R>::ON_UPPER
               && _basisStatusCols[c] != SPxSolverBase<R>::FIXED)
         {
            if(_basisStatusCols[c] == SPxSolverBase<R>::BASIC
                  || _basisStatusCols[c] == SPxSolverBase<R>::UNDEFINED)
               isSolBasic = false;
            else
               _basisStatusCols[c] = SPxSolverBase<R>::ON_UPPER;
         }
      }
   }

   // update solution
   sol._primal = _workSol._primal;
   sol._slacks = _workSol._slacks;
   sol._dual = _workSol._dual;
   sol._redCost = _workSol._redCost;

   if(!isSolBasic)
   {
      SPX_MSG_WARNING(spxout, spxout << "Warning: Reconstructed solution not basic.\n");
      _hasBasis = false;
   }

   // stop timing
   _statistics->reconstructionTime->stop();

   return success;
}